

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O0

double * __thiscall Agent::CFRAgent<Kuhn::Game>::strategy(CFRAgent<Kuhn::Game> *this,Game *game)

{
  mapped_type *ppNVar1;
  double *pdVar2;
  string local_38;
  Game *local_18;
  Game *game_local;
  CFRAgent<Kuhn::Game> *this_local;
  
  local_18 = game;
  game_local = (Game *)this;
  Kuhn::Game::infoSetStr_abi_cxx11_(&local_38,game);
  ppNVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
            ::at(&this->mStrategy,&local_38);
  pdVar2 = Trainer::Node::averageStrategy(*ppNVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return pdVar2;
}

Assistant:

const double *CFRAgent<T>::strategy(const T &game) const {
    return mStrategy.at(game.infoSetStr())->averageStrategy();
}